

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  nes_system *system_00;
  undefined8 uVar2;
  long lVar3;
  float fVar4;
  char *local_248;
  ulong local_240;
  uint64_t frame_time;
  int local_230;
  float aspect_ratio;
  SDL_Event evt;
  SDL_Rect dstrect;
  SDL_Scancode key_up_scancode;
  int has_key_up;
  int h;
  int w;
  uint64_t begin_frame;
  SDL_AudioSpec audio_spec_obtained;
  SDL_AudioSpec audio_spec_desired;
  nes_system *system;
  nes_config config;
  char local_128 [4];
  int quit;
  char title [256];
  char *rom_path;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    local_248 = "rom.nes";
  }
  else {
    local_248 = argv[1];
  }
  config.cpu_callback._4_4_ = 0;
  init_audio_ring_buf();
  snprintf(local_128,0x100,"NESM - %s",local_248);
  snprintf(save_path,0x400,"%s_sav",local_248);
  system._0_4_ = 0;
  config.source.memory.data_size = (size_t)local_248;
  config.source.cartridge = (nes_cartridge *)0x0;
  config.client_data = on_nes_input;
  config.input_callback = on_nes_video;
  config.video_callback = on_nes_audio;
  config.audio_callback = (_func_void_nes_audio_output_ptr_void_ptr *)0x0;
  config.memory_callback =
       (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0;
  system_00 = nes_system_create((nes_config *)&system);
  if (system_00 == (nes_system *)0x0) {
    fprintf(_stderr,"Failed to initialized NES system.\n");
    argv_local._4_4_ = -1;
  }
  else {
    iVar1 = SDL_Init(0x230);
    if (iVar1 < 0) {
      uVar2 = SDL_GetError();
      SDL_LogError(0,"Failed to initialized SDL2: %s\n",uVar2);
      argv_local._4_4_ = -1;
    }
    else {
      wnd = (SDL_Window *)
            SDL_CreateWindow(local_128,0x2fff0000,0x2fff0000,wnd_scale << 8,wnd_scale * 0xe0,0x28);
      if (wnd == (SDL_Window *)0x0) {
        uVar2 = SDL_GetError();
        SDL_LogError(0,"Failed to create window: %s\n",uVar2);
        argv_local._4_4_ = -1;
      }
      else {
        renderer = (SDL_Renderer *)SDL_CreateRenderer(wnd,0xffffffff,6);
        if (renderer == (SDL_Renderer *)0x0) {
          uVar2 = SDL_GetError();
          SDL_LogError(0,"Failed to create renderer: %s\n",uVar2);
          argv_local._4_4_ = -1;
        }
        else {
          memset(&audio_spec_obtained.userdata,0,0x20);
          audio_spec_obtained.userdata._0_4_ = 0xac44;
          audio_spec_obtained.userdata._6_1_ = 1;
          audio_spec_obtained.userdata._4_2_ = 0x8010;
          audio_device_id = SDL_OpenAudioDevice(0,0,&audio_spec_obtained.userdata,&begin_frame);
          SDL_PauseAudioDevice(audio_device_id,0);
          SDL_SetHint("SDL_RENDER_SCALE_QUALITY","0");
          texture = (SDL_Texture *)SDL_CreateTexture(renderer,0x16762004,1,0x100,0xe0);
          if (texture == (SDL_Texture *)0x0) {
            uVar2 = SDL_GetError();
            SDL_LogError(0,"Failed to create texture: %s\n",uVar2);
            argv_local._4_4_ = -1;
          }
          else {
            texture_buffer = (uint32_t *)malloc(0x38000);
            memset(controller,0,0x10);
            SDL_ShowWindow(wnd);
            while (config.cpu_callback._4_4_ == 0) {
              _h = SDL_GetPerformanceCounter();
              dstrect.h = 0;
              dstrect.w = 0;
              fVar4 = (float)video_srcrect.w / (float)video_srcrect.h;
              while (iVar1 = SDL_PollEvent(&local_230), iVar1 != 0) {
                if (local_230 == 0x100) {
                  config.cpu_callback._4_4_ = 1;
                }
                else if (local_230 == 0x301) {
                  dstrect.h = 1;
                  dstrect.w = evt.jaxis.which;
                }
                else if (local_230 == 0x605) {
                  handle_joystick_added(evt.type);
                }
                else if (local_230 == 0x606) {
                  handle_joystick_removed(evt.type);
                }
              }
              if (dstrect.h != 0) {
                handle_shortcut_key(system_00,dstrect.w);
              }
              SDL_GetWindowSize(wnd,&has_key_up,&key_up_scancode);
              if ((float)has_key_up / (float)(int)key_up_scancode < fVar4) {
                evt.edit.length = 0;
                dstrect.x = has_key_up;
                dstrect.y = (int)((float)has_key_up / fVar4);
                evt._52_4_ = (int)(key_up_scancode - dstrect.y) >> 1;
              }
              else {
                evt._52_4_ = 0;
                dstrect.y = key_up_scancode;
                dstrect.x = (int)((float)(int)key_up_scancode * fVar4);
                evt.edit.length = has_key_up - dstrect.x >> 1;
              }
              nes_system_frame(system_00);
              SDL_SetRenderDrawColor(renderer,0,0,0);
              SDL_RenderClear(renderer);
              SDL_RenderCopy(renderer,texture,&video_srcrect,&evt.edit.length);
              SDL_RenderPresent(renderer);
              local_240 = 0;
              while (local_240 < 0x682) {
                lVar3 = SDL_GetPerformanceCounter();
                lVar3 = lVar3 - _h;
                local_240 = SDL_GetPerformanceFrequency();
                local_240 = (ulong)(lVar3 * 100000) / local_240;
                if ((local_240 < 0x682) && (100 < 0x682 - local_240)) {
                  SDL_Delay(1);
                }
              }
            }
            SDL_DestroyWindow(wnd);
            SDL_CloseAudioDevice(audio_device_id);
            nes_system_destroy(system_00);
            free(texture_buffer);
            free(audio_ring_buf.buffer);
            if (state_buffer != (void *)0x0) {
              free(state_buffer);
            }
            if (controller[0] != (SDL_GameController *)0x0) {
              SDL_GameControllerClose(controller[0]);
            }
            if (controller[1] != (SDL_GameController *)0x0) {
              SDL_GameControllerClose(controller[1]);
            }
            SDL_Quit();
            argv_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    const char*     rom_path = argc > 1 ? argv[1] : "rom.nes";
    char            title[256];
    int             quit = 0;
    nes_config      config;
    nes_system*     system = 0;
    SDL_AudioSpec   audio_spec_desired, audio_spec_obtained;

    init_audio_ring_buf();

    snprintf(title, 256, "NESM - %s", rom_path);
    snprintf(save_path, 1024, "%s_sav", rom_path);

    config.source_type = NES_SOURCE_FILE;
    config.source.file_path = rom_path;
    config.client_data = 0;
    config.input_callback = &on_nes_input;
    config.video_callback = &on_nes_video;
    config.audio_callback = &on_nes_audio;
    config.memory_callback = 0;
    config.cpu_callback = 0;

    system = nes_system_create(&config);
    if (!system)
    {
        fprintf(stderr, "Failed to initialized NES system.\n");
        return -1;
    }

    if (SDL_Init(SDL_INIT_VIDEO | SDL_INIT_AUDIO | SDL_INIT_JOYSTICK) < 0)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION,"Failed to initialized SDL2: %s\n", SDL_GetError());
        return -1;
    }

    wnd = SDL_CreateWindow(title, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, 
            TEXTURE_WIDTH * wnd_scale, TEXTURE_HEIGHT * wnd_scale, SDL_WINDOW_RESIZABLE | SDL_WINDOW_HIDDEN);
    if (!wnd)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION,"Failed to create window: %s\n", SDL_GetError());
        return -1;
    }

    renderer = SDL_CreateRenderer(wnd, -1, SDL_RENDERER_ACCELERATED | SDL_RENDERER_PRESENTVSYNC);
    if (!renderer)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION,"Failed to create renderer: %s\n", SDL_GetError());
        return -1;
    }

    memset(&audio_spec_desired, 0, sizeof(SDL_AudioSpec));
    audio_spec_desired.freq = SAMPLE_RATE;
    audio_spec_desired.channels = 1;
    audio_spec_desired.format = AUDIO_S16;
    audio_spec_desired.samples = 512;
    audio_spec_desired.callback = sdl_audio_callback;
    audio_device_id = SDL_OpenAudioDevice(0, 0, &audio_spec_desired, &audio_spec_obtained, 0);
    if (audio_device_id < 0)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Failed to open audio device: %s\n", SDL_GetError());
    }
    SDL_PauseAudioDevice(audio_device_id, 0);

    SDL_SetHint(SDL_HINT_RENDER_SCALE_QUALITY, "0");
    texture = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_ABGR8888, SDL_TEXTUREACCESS_STREAMING, TEXTURE_WIDTH, TEXTURE_HEIGHT);
    if (!texture)
    {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION,"Failed to create texture: %s\n", SDL_GetError());
        return -1;
    }

    texture_buffer = (uint32_t*)malloc(TEXTURE_WIDTH * TEXTURE_HEIGHT * sizeof(uint32_t));

    memset(&controller, 0, 2 * sizeof(SDL_GameController*));

    SDL_ShowWindow(wnd);

    while(!quit)
    {
        uint64_t begin_frame = SDL_GetPerformanceCounter();

        int w, h, has_key_up = 0;
        SDL_Scancode key_up_scancode = (SDL_Scancode)0;
        SDL_Rect dstrect;
        SDL_Event evt;
        float aspect_ratio = (float)video_srcrect.w / (float)video_srcrect.h;

        while (SDL_PollEvent(&evt))
        {
            if (evt.type == SDL_QUIT) quit = 1;
            else if (evt.type == SDL_KEYUP)
            {
                has_key_up = 1;
                key_up_scancode = evt.key.keysym.scancode;
            }
            else if (evt.type == SDL_JOYDEVICEADDED)
            {
                handle_joystick_added(evt.jdevice.which);
            }
            else if (evt.type == SDL_JOYDEVICEREMOVED)
            {
                handle_joystick_removed(evt.jdevice.which);
            }
        }

        if (has_key_up)
            handle_shortcut_key(system, key_up_scancode);

        SDL_GetWindowSize(wnd, &w, &h);
        if (((float)w / (float)h) >= aspect_ratio)
        {
            dstrect.y = 0;
            dstrect.h = h;
            dstrect.w = (int)((float)h * aspect_ratio);
            dstrect.x = (w - dstrect.w)>>1;
        }
        else
        {
            dstrect.x = 0;
            dstrect.w = w;
            dstrect.h = (int)((float)w / aspect_ratio);
            dstrect.y = (h - dstrect.h)>>1;
        }

        nes_system_frame(system);

        SDL_SetRenderDrawColor(renderer, 0, 0, 0, 0);
        SDL_RenderClear(renderer);
        SDL_RenderCopy(renderer, texture, &video_srcrect, &dstrect);
        SDL_RenderPresent(renderer);

        uint64_t frame_time = 0;
        while(frame_time < 1666)
        {
           frame_time  = ((SDL_GetPerformanceCounter() - begin_frame)*100000)/SDL_GetPerformanceFrequency();
           if (frame_time < 1666 && (1666 - frame_time) > 100)
               SDL_Delay(1);
        }
    }

    SDL_DestroyWindow(wnd);
    if (audio_device_id >= 0)
        SDL_CloseAudioDevice(audio_device_id);

    nes_system_destroy(system);
    free(texture_buffer);
    free(audio_ring_buf.buffer);

    if (state_buffer)
        free(state_buffer);

    if (controller[0]) SDL_GameControllerClose(controller[0]);
    if (controller[1]) SDL_GameControllerClose(controller[1]);

    SDL_Quit();
    return 0;
}